

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

wchar_t fmt::v7::detail::decimal_point_impl<wchar_t>(locale_ref loc)

{
  wchar_t wVar1;
  numpunct *pnVar2;
  locale_ref loc_local;
  
  locale_ref::get<std::locale>(&loc_local);
  pnVar2 = std::use_facet<std::__cxx11::numpunct<wchar_t>>((locale *)&loc_local);
  wVar1 = (**(code **)(*(long *)pnVar2 + 0x10))(pnVar2);
  std::locale::~locale((locale *)&loc_local);
  return wVar1;
}

Assistant:

FMT_FUNC Char decimal_point_impl(locale_ref loc) {
  return std::use_facet<std::numpunct<Char>>(loc.get<std::locale>())
      .decimal_point();
}